

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

uint upsampled_setup_center_error
               (MACROBLOCKD *xd,AV1_COMMON *cm,MV *bestmv,SUBPEL_SEARCH_VAR_PARAMS *var_params,
               MV_COST_PARAMS *mv_cost_params,uint *sse1,int *distortion)

{
  uint uVar1;
  int iVar2;
  uint besterr;
  uint *in_stack_0000c0d0;
  SUBPEL_SEARCH_VAR_PARAMS *in_stack_0000c0d8;
  MV *in_stack_0000c0e0;
  AV1_COMMON *in_stack_0000c0e8;
  MACROBLOCKD *in_stack_0000c0f0;
  undefined4 in_stack_ffffffffffffffc8;
  
  uVar1 = upsampled_pref_error
                    (in_stack_0000c0f0,in_stack_0000c0e8,in_stack_0000c0e0,in_stack_0000c0d8,
                     in_stack_0000c0d0);
  *sse1 = uVar1;
  iVar2 = mv_err_cost_((MV *)CONCAT44(uVar1,in_stack_ffffffffffffffc8),(MV_COST_PARAMS *)0x2756e3);
  return iVar2 + uVar1;
}

Assistant:

static unsigned int upsampled_setup_center_error(
    MACROBLOCKD *xd, const AV1_COMMON *const cm, const MV *bestmv,
    const SUBPEL_SEARCH_VAR_PARAMS *var_params,
    const MV_COST_PARAMS *mv_cost_params, unsigned int *sse1, int *distortion) {
  unsigned int besterr = upsampled_pref_error(xd, cm, bestmv, var_params, sse1);
  *distortion = besterr;
  besterr += mv_err_cost_(bestmv, mv_cost_params);
  return besterr;
}